

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O1

void calc_similarity_internal<float,long,double>
               (float *numeric_data,int *categ_data,float *Xc,long *Xc_ind,long *Xc_indptr,
               size_t nrows,int nthreads,bool assume_full_distr,bool standardize_dist,bool as_kernel
               ,IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,double *tmat,double *rmat,
               size_t n_from,bool use_indexed_references,TreesIndexer *indexer,bool is_col_major,
               size_t ld_numeric,size_t ld_categ)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer puVar5;
  pointer puVar6;
  WorkerForSimilarity *__cur;
  ExtIsoForest *pEVar7;
  runtime_error *prVar8;
  long lVar9;
  pointer pWVar10;
  long lVar11;
  size_t ntrees;
  bool bVar12;
  size_t local_f0;
  exception_ptr ex;
  vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_> worker_memory;
  SignalSwitcher local_b0;
  long *local_98;
  PredictionData<float,_long> local_90;
  
  if ((1 < nrows) ||
     ((((indexer != (TreesIndexer *)0x0 && (use_indexed_references)) &&
       (pSVar1 = (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_start,
       pSVar1 != (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_finish)) &&
      ((pSVar1->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start !=
       (pSVar1->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish)))) {
    if ((as_kernel) &&
       (((!use_indexed_references || tmat != (double *)0x0 || (indexer == (TreesIndexer *)0x0)) ||
        ((pSVar1 = (indexer->indices).
                   super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                   super__Vector_impl_data._M_start,
         pSVar1 != (indexer->indices).
                   super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                   super__Vector_impl_data._M_finish &&
         ((pSVar1->reference_points).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (pSVar1->reference_points).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish)))))) {
      indexer = (TreesIndexer *)0x0;
    }
    if (model_outputs != (IsoForest *)0x0 && indexer != (TreesIndexer *)0x0) {
      bVar12 = model_outputs->missing_action == Divide;
      if (bVar12) {
        indexer = (TreesIndexer *)0x0;
      }
      if (bVar12 && use_indexed_references) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar8,"Invalid indexer - cannot use references from it.\n");
        goto LAB_002d4289;
      }
      if (model_outputs->new_cat_action == Weighted) {
        bVar12 = model_outputs->cat_split_type == SubSet;
        if (categ_data != (int *)0x0 && bVar12) {
          indexer = (TreesIndexer *)0x0;
        }
        if ((categ_data != (int *)0x0 && bVar12) && use_indexed_references) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar8,"Invalid indexer - cannot use references from it.\n");
          goto LAB_002d4289;
        }
      }
    }
    if (indexer != (TreesIndexer *)0x0 && !as_kernel) {
      pSVar1 = (indexer->indices).
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar2 = (indexer->indices).
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((pSVar1 == pSVar2) ||
         ((pSVar1->node_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (pSVar1->node_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        local_98 = Xc_indptr;
        if ((use_indexed_references && pSVar1 != pSVar2) &&
           ((pSVar1->reference_points).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pSVar1->reference_points).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish)) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar8,"Indexer was built without distances. Cannot use references from it.\n")
          ;
          goto LAB_002d4289;
        }
        calc_similarity_internal<float,long,double>();
        indexer = (TreesIndexer *)0x0;
        Xc_indptr = local_98;
      }
    }
    if ((indexer == (TreesIndexer *)0x0 && !is_col_major) &&
       ((Xc_indptr != (long *)0x0 ||
        ((nrows != 1 &&
         ((numeric_data != (float *)0x0 && 1 < ld_numeric ||
          (1 < ld_categ && categ_data != (int *)0x0)))))))) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar8,"Cannot calculate distances with row-major data without indexer.\n");
      goto LAB_002d4289;
    }
    if (indexer != (TreesIndexer *)0x0) {
      if (((use_indexed_references && tmat == (double *)0x0) &&
          (pSVar1 = (indexer->indices).
                    super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                    super__Vector_impl_data._M_start,
          pSVar1 != (indexer->indices).
                    super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                    super__Vector_impl_data._M_finish)) &&
         ((pSVar1->reference_points).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pSVar1->reference_points).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        if (assume_full_distr) {
          if (as_kernel) {
            kernel_to_references<float,long>
                      (indexer,model_outputs,model_outputs_ext,numeric_data,categ_data,Xc,Xc_ind,
                       Xc_indptr,is_col_major,ld_numeric,ld_categ,nrows,nthreads,rmat,
                       standardize_dist);
            return;
          }
          calc_similarity_from_indexer_with_references<float,long>
                    (numeric_data,categ_data,Xc,Xc_ind,Xc_indptr,nrows,nthreads,standardize_dist,
                     model_outputs,model_outputs_ext,rmat,indexer,is_col_major,ld_numeric,ld_categ);
          return;
        }
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar8,
                   "Cannot calculate distances to reference points in indexer with \'assume_full_distr=false\'.\n"
                  );
        calc_similarity_internal<float,long,double>();
        goto LAB_002d41ae;
      }
      if (!as_kernel) {
        calc_similarity_from_indexer<float,long>
                  (numeric_data,categ_data,Xc,Xc_ind,Xc_indptr,nrows,nthreads,assume_full_distr,
                   standardize_dist,model_outputs,model_outputs_ext,tmat,rmat,n_from,indexer,
                   is_col_major,ld_numeric,ld_categ);
        return;
      }
    }
    local_90.is_col_major = false;
    local_90.ncols_numeric = 0;
    local_90.ncols_categ = 0;
    local_90.Xr = (float *)0x0;
    local_90.Xr_ind = (long *)0x0;
    local_90.Xr_indptr = (long *)0x0;
    pEVar7 = model_outputs_ext;
    if (model_outputs != (IsoForest *)0x0) {
      pEVar7 = (ExtIsoForest *)model_outputs;
    }
    local_f0 = n_from;
    if (tmat != (double *)0x0) {
      local_f0 = 0;
    }
    local_90.numeric_data = numeric_data;
    local_90.categ_data = categ_data;
    local_90.nrows = nrows;
    local_90.Xc = Xc;
    local_90.Xc_ind = Xc_ind;
    local_90.Xc_indptr = Xc_indptr;
    if (nrows < 0xffffffff || local_f0 != 0) {
      pvVar3 = (pEVar7->hplanes).
               super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = (pEVar7->hplanes).
               super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      worker_memory.super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      worker_memory.super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      worker_memory.super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      worker_memory.super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x98);
      pWVar10 = worker_memory.
                super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>.
                _M_impl.super__Vector_impl_data._M_start + 1;
      worker_memory.super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           worker_memory.
           super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>._M_impl.
           super__Vector_impl_data._M_start;
      worker_memory.super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = pWVar10;
      memset(worker_memory.
             super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>._M_impl.
             super__Vector_impl_data._M_start,0,0x98);
      local_b0.is_active = handle_is_locked == false;
      worker_memory.super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>.
      _M_impl.super__Vector_impl_data._M_finish = pWVar10;
      if (local_b0.is_active) {
        handle_is_locked = true;
        interrupt_switch = false;
        local_b0.old_sig = (sig_t_)signal(2,set_interrup_global_variable);
      }
      check_interrupt_switch(&local_b0);
      if (((tmat == (double *)0x0) && (indexer != (TreesIndexer *)0x0)) &&
         ((use_indexed_references &&
          (pSVar1 = (indexer->indices).
                    super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                    super__Vector_impl_data._M_start,
          pSVar1 != (indexer->indices).
                    super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                    super__Vector_impl_data._M_finish)))) {
        puVar5 = (pSVar1->reference_points).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar6 = (pSVar1->reference_points).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((puVar5 != puVar6) &&
           ((as_kernel ||
            ((pSVar1->node_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start !=
             (pSVar1->node_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish)))) {
          local_f0 = (long)puVar6 - (long)puVar5 >> 3;
        }
      }
      ntrees = ((long)pvVar4 - (long)pvVar3 >> 3) * -0x5555555555555555;
      if (model_outputs == (IsoForest *)0x0) {
        if (pvVar4 != pvVar3) {
          lVar9 = ntrees + (ntrees == 0);
          lVar11 = 0;
          do {
            if (interrupt_switch == false) {
              initialize_worker_for_sim<PredictionData<float,long>>
                        (worker_memory.
                         super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>
                         ._M_impl.super__Vector_impl_data._M_start,&local_90,(IsoForest *)0x0,
                         model_outputs_ext,local_f0,assume_full_distr);
              traverse_hplane_sim<PredictionData<float,long>,double>
                        (worker_memory.
                         super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>
                         ._M_impl.super__Vector_impl_data._M_start,&local_90,model_outputs_ext,
                         (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                         ((long)&(((model_outputs_ext->hplanes).
                                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl
                         + lVar11),0,as_kernel);
            }
            lVar11 = lVar11 + 0x18;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
      }
      else if (pvVar4 != pvVar3) {
        lVar9 = ntrees + (ntrees == 0);
        lVar11 = 0;
        do {
          if (interrupt_switch == false) {
            initialize_worker_for_sim<PredictionData<float,long>>
                      (worker_memory.
                       super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>
                       ._M_impl.super__Vector_impl_data._M_start,&local_90,model_outputs,
                       (ExtIsoForest *)0x0,local_f0,assume_full_distr);
            traverse_tree_sim<PredictionData<float,long>,double>
                      (worker_memory.
                       super__Vector_base<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>
                       ._M_impl.super__Vector_impl_data._M_start,&local_90,model_outputs,
                       (vector<IsoTree,_std::allocator<IsoTree>_> *)
                       ((long)&(((model_outputs->trees).
                                 super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl +
                       lVar11),0,as_kernel);
          }
          lVar11 = lVar11 + 0x18;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      check_interrupt_switch(&local_b0);
      gather_sim_result<PredictionData<float,long>,InputData<float,long>,WorkerMemory<ImputedData<long,double>,double,float>>
                (&worker_memory,
                 (vector<WorkerMemory<ImputedData<long,_double>,_double,_float>,_std::allocator<WorkerMemory<ImputedData<long,_double>,_double,_float>_>_>
                  *)0x0,&local_90,(InputData<float,_long> *)0x0,model_outputs,model_outputs_ext,tmat
                 ,rmat,local_f0,ntrees,assume_full_distr,standardize_dist,as_kernel,1);
      check_interrupt_switch(&local_b0);
      if ((local_b0.is_active == true) && (handle_is_locked == true)) {
        interrupt_switch = false;
        signal(2,(__sighandler_t)local_b0.old_sig);
        local_b0.is_active = false;
        handle_is_locked = false;
      }
      std::vector<WorkerForSimilarity,_std::allocator<WorkerForSimilarity>_>::~vector
                (&worker_memory);
      return;
    }
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar8,"Number of rows implies too large distance matrix (integer overflow).");
  }
  else {
LAB_002d41ae:
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"Cannot calculate distances from less than 2 rows.\n");
  }
LAB_002d4289:
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void calc_similarity_internal(
                     real_t numeric_data[], int categ_data[],
                     real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                     size_t nrows, int nthreads,
                     bool assume_full_distr, bool standardize_dist, bool as_kernel,
                     IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                     double tmat[], double rmat[], size_t n_from, bool use_indexed_references,
                     TreesIndexer *indexer, bool is_col_major, size_t ld_numeric, size_t ld_categ)
{
    if (nrows < 2 && (!use_indexed_references || indexer == NULL || indexer->indices.empty() || indexer->indices.front().reference_points.empty()))
        throw std::runtime_error("Cannot calculate distances from less than 2 rows.\n");
    if (as_kernel && (tmat != NULL || !use_indexed_references || (indexer != NULL && !indexer->indices.empty() && indexer->indices.front().reference_points.empty())))
        indexer = NULL;

    if (indexer != NULL && model_outputs != NULL)
    {
        if (model_outputs->missing_action == Divide) {
            indexer = NULL;
            if (use_indexed_references) throw std::runtime_error("Invalid indexer - cannot use references from it.\n");
        }
        if (model_outputs->new_cat_action == Weighted && model_outputs->cat_split_type == SubSet && categ_data != NULL) {
            indexer = NULL;
            if (use_indexed_references) throw std::runtime_error("Invalid indexer - cannot use references from it.\n");
        }
    }
    if (
        !as_kernel &&
        indexer != NULL &&
        (indexer->indices.empty() || indexer->indices.front().node_distances.empty())
    ) {
        if (use_indexed_references && !indexer->indices.empty() && !indexer->indices.front().reference_points.empty())
            throw std::runtime_error("Indexer was built without distances. Cannot use references from it.\n");
        else {
            indexer = NULL;
            print_errmsg("Indexer has no pre-computed distances, will not be used for distance calculations.\n");
        }
    }
    if (
        !is_col_major &&
        indexer == NULL &&
        (
            Xc_indptr != NULL
                ||
            (nrows != 1 &&
             ((numeric_data != NULL && ld_numeric > 1) || (categ_data != NULL && ld_categ > 1)))
        )
    )
        throw std::runtime_error("Cannot calculate distances with row-major data without indexer.\n");
    if (indexer != NULL)
    {
        if (use_indexed_references && tmat == NULL && !indexer->indices.empty() && !indexer->indices.front().reference_points.empty())
        {
            if (unlikely(!assume_full_distr))
                throw std::runtime_error("Cannot calculate distances to reference points in indexer with 'assume_full_distr=false'.\n");
            
            if (!as_kernel)
            {
                calc_similarity_from_indexer_with_references(
                    numeric_data, categ_data,
                    Xc, Xc_ind, Xc_indptr,
                    nrows, nthreads, standardize_dist,
                    model_outputs, model_outputs_ext,
                    rmat,
                    indexer, is_col_major, ld_numeric, ld_categ
                );
            }
            
            else
            {
                kernel_to_references(*indexer,
                                     model_outputs, model_outputs_ext,
                                     numeric_data, categ_data,
                                     Xc, Xc_ind, Xc_indptr,
                                     is_col_major, ld_numeric, ld_categ,
                                     nrows, nthreads,
                                     rmat,
                                     standardize_dist);
            }
        }

        else
        {
            if (as_kernel) goto skip_indexer_if_kernel;
            calc_similarity_from_indexer(
                numeric_data, categ_data,
                Xc, Xc_ind, Xc_indptr,
                nrows, nthreads, assume_full_distr, standardize_dist,
                model_outputs, model_outputs_ext,
                tmat, rmat, n_from,
                indexer, is_col_major, ld_numeric, ld_categ
            );
        }

        return;
    }
    skip_indexer_if_kernel:

    PredictionData<real_t, sparse_ix>
                   prediction_data = {numeric_data, categ_data, nrows,
                                      false, 0, 0,
                                      Xc, Xc_ind, Xc_indptr,
                                      NULL, NULL, NULL};

    size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();

    if (tmat != NULL) n_from = 0;

    if (n_from == 0) {
        #if SIZE_MAX == UINT32_MAX
        size_t lim_rows = (size_t)UINT16_MAX - (size_t)1;
        #elif SIZE_MAX == UINT64_MAX
        size_t lim_rows = (size_t)UINT32_MAX - (size_t)1;
        #else
        size_t lim_rows = (size_t)std::ceil(std::sqrt((ldouble_safe)SIZE_MAX));
        #endif
        if (nrows > lim_rows)
            throw std::runtime_error("Number of rows implies too large distance matrix (integer overflow).");
    }

    if ((size_t)nthreads > ntrees)
        nthreads = (int)ntrees;
    #ifdef _OPENMP
    std::vector<WorkerForSimilarity> worker_memory(nthreads);
    #else
    std::vector<WorkerForSimilarity> worker_memory(1);
    nthreads = 1;
    #endif

    /* Global variable that determines if the procedure receives a stop signal */
    SignalSwitcher ss = SignalSwitcher();
    check_interrupt_switch(ss);
    #if defined(DONT_THROW_ON_INTERRUPT)
    if (interrupt_switch) return;
    #endif
    /* For handling exceptions */
    bool threw_exception = false;
    std::exception_ptr ex = NULL;

    if (
        tmat == NULL &&
        use_indexed_references &&
        indexer != NULL &&
        !indexer->indices.empty() &&
        !indexer->indices.front().reference_points.empty() &&
        (as_kernel || !indexer->indices.front().node_distances.empty())
    ) {
        n_from = indexer->indices.front().reference_points.size();
    }

    if (model_outputs != NULL)
    {
        #pragma omp parallel for schedule(dynamic) num_threads(nthreads) \
                shared(ntrees, worker_memory, prediction_data, model_outputs, ex, threw_exception, n_from)
        for (size_t_for tree = 0; tree < (decltype(tree))ntrees; tree++)
        {
            if (threw_exception || interrupt_switch) continue;
            try
            {
                initialize_worker_for_sim(worker_memory[omp_get_thread_num()], prediction_data,
                                          model_outputs, NULL, n_from, assume_full_distr);
                traverse_tree_sim<PredictionData<real_t, sparse_ix>, ldouble_safe>(
                                  worker_memory[omp_get_thread_num()],
                                  prediction_data,
                                  *model_outputs,
                                  model_outputs->trees[tree],
                                  (size_t)0,
                                  as_kernel);
            }

            catch (...)
            {
                #pragma omp critical
                {
                    if (!threw_exception)
                    {
                        threw_exception = true;
                        ex = std::current_exception();
                    }
                }
            }
        }
    }

    else
    {
        #pragma omp parallel for schedule(dynamic) num_threads(nthreads) \
                shared(ntrees, worker_memory, prediction_data, model_outputs_ext, ex, threw_exception, n_from)
        for (size_t_for hplane = 0; hplane < (decltype(hplane))ntrees; hplane++)
        {
            if (threw_exception || interrupt_switch) continue;
            try
            {
                initialize_worker_for_sim(worker_memory[omp_get_thread_num()], prediction_data,
                                          NULL, model_outputs_ext, n_from, assume_full_distr);
                traverse_hplane_sim<PredictionData<real_t, sparse_ix>, ldouble_safe>(
                                    worker_memory[omp_get_thread_num()],
                                    prediction_data,
                                    *model_outputs_ext,
                                    model_outputs_ext->hplanes[hplane],
                                    (size_t)0,
                                    as_kernel);
            }

            catch (...)
            {
                #pragma omp critical
                {
                    if (!threw_exception)
                    {
                        threw_exception = true;
                        ex = std::current_exception();
                    }
                }
            }
        }    
    }

    check_interrupt_switch(ss);
    #if defined(DONT_THROW_ON_INTERRUPT)
    if (interrupt_switch) return;
    #endif

    if (threw_exception)
        std::rethrow_exception(ex);
    
    /* gather and transform the results */
    gather_sim_result< PredictionData<real_t, sparse_ix>,
                       InputData<real_t, sparse_ix>,
                       WorkerMemory<ImputedData<sparse_ix, ldouble_safe>, ldouble_safe, real_t> >
                     (&worker_memory, NULL,
                      &prediction_data, NULL,
                      model_outputs, model_outputs_ext,
                      tmat, rmat, n_from,
                      ntrees, assume_full_distr,
                      standardize_dist, as_kernel, nthreads);

    check_interrupt_switch(ss);
    #if defined(DONT_THROW_ON_INTERRUPT)
    if (interrupt_switch) return;
    #endif
}